

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O3

bool __thiscall
burst::buffered_chunk_iterator<std::_List_const_iterator<char>,_int>::equal
          (buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *this,
          buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *that)

{
  element_type *peVar1;
  
  if ((this->m_end)._M_node != (that->m_end)._M_node) {
    __assert_fail("this->m_end == that.m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                  ,0x6b,
                  "bool burst::buffered_chunk_iterator<std::_List_const_iterator<char>, int>::equal(const buffered_chunk_iterator<Iterator, Integral> &) const [Iterator = std::_List_const_iterator<char>, Integral = int]"
                 );
  }
  peVar1 = (this->m_chunk).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (that->m_chunk).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    if (this->m_chunk_size == that->m_chunk_size) {
      return peVar1 == this->m_chunk_end && (this->m_current)._M_node == (that->m_current)._M_node;
    }
    __assert_fail("this->m_chunk_size == that.m_chunk_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                  ,0x6d,
                  "bool burst::buffered_chunk_iterator<std::_List_const_iterator<char>, int>::equal(const buffered_chunk_iterator<Iterator, Integral> &) const [Iterator = std::_List_const_iterator<char>, Integral = int]"
                 );
  }
  __assert_fail("this->m_chunk == that.m_chunk",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                ,0x6c,
                "bool burst::buffered_chunk_iterator<std::_List_const_iterator<char>, int>::equal(const buffered_chunk_iterator<Iterator, Integral> &) const [Iterator = std::_List_const_iterator<char>, Integral = int]"
               );
}

Assistant:

bool equal (const buffered_chunk_iterator & that) const
        {
            assert(this->m_end == that.m_end);
            assert(this->m_chunk == that.m_chunk);
            assert(this->m_chunk_size == that.m_chunk_size);
            return this->m_current == that.m_current && empty();
        }